

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O1

bool __thiscall
moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::try_dequeue<_zframe_t*>
          (ConcurrentQueue<_zframe_t*,MyTraits> *this,consumer_token_t *token,_zframe_t **item)

{
  uint uVar1;
  long lVar2;
  ConcurrentQueueProducerTypelessBase *pCVar3;
  ConcurrentQueueProducerTypelessBase *pCVar4;
  ExplicitProducer *pEVar5;
  bool bVar6;
  uint uVar7;
  ConcurrentQueueProducerTypelessBase *pCVar8;
  uint32_t uVar9;
  ExplicitProducer *pEVar10;
  int iVar11;
  ProducerToken **ppPVar12;
  ConcurrentQueueProducerTypelessBase *pCVar13;
  ExplicitProducer *this_00;
  bool bVar14;
  
  if ((token->desiredProducer == (ConcurrentQueueProducerTypelessBase *)0x0) ||
     (token->lastKnownGlobalOffset != *(uint32_t *)(this + 0x260))) {
    lVar2 = *(long *)this;
    pCVar3 = token->desiredProducer;
    if (lVar2 != 0 || pCVar3 != (ConcurrentQueueProducerTypelessBase *)0x0) {
      uVar1 = *(uint *)(this + 8);
      uVar9 = *(uint32_t *)(this + 0x260);
      if (pCVar3 == (ConcurrentQueueProducerTypelessBase *)0x0) {
        pCVar8 = (ConcurrentQueueProducerTypelessBase *)(lVar2 + 8);
        if (lVar2 == 0) {
          pCVar8 = (ConcurrentQueueProducerTypelessBase *)0x0;
        }
        token->desiredProducer = pCVar8;
        iVar11 = ~(token->initialOffset % uVar1) + uVar1;
        pCVar13 = pCVar8;
        if (iVar11 != 0) {
          do {
            pCVar4 = pCVar13->next;
            ppPVar12 = &pCVar4[-1].token;
            if (pCVar4 == (ConcurrentQueueProducerTypelessBase *)0x0) {
              ppPVar12 = (ProducerToken **)0x0;
            }
            pCVar13 = (ConcurrentQueueProducerTypelessBase *)(ppPVar12 + 1);
            if (pCVar4 == (ConcurrentQueueProducerTypelessBase *)0x0) {
              pCVar13 = pCVar8;
            }
            iVar11 = iVar11 + -1;
          } while (iVar11 != 0);
          token->desiredProducer = pCVar13;
        }
      }
      uVar7 = uVar9 - token->lastKnownGlobalOffset;
      if (uVar1 <= uVar7) {
        uVar7 = uVar7 % uVar1;
      }
      if (uVar7 != 0) {
        pCVar8 = (ConcurrentQueueProducerTypelessBase *)(lVar2 + 8);
        pCVar13 = token->desiredProducer;
        if (lVar2 == 0) {
          pCVar8 = (ConcurrentQueueProducerTypelessBase *)0x0;
        }
        do {
          pCVar4 = pCVar13->next;
          ppPVar12 = &pCVar4[-1].token;
          if (pCVar4 == (ConcurrentQueueProducerTypelessBase *)0x0) {
            ppPVar12 = (ProducerToken **)0x0;
          }
          pCVar13 = (ConcurrentQueueProducerTypelessBase *)(ppPVar12 + 1);
          if (pCVar4 == (ConcurrentQueueProducerTypelessBase *)0x0) {
            pCVar13 = pCVar8;
          }
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
        token->desiredProducer = pCVar13;
      }
      token->lastKnownGlobalOffset = uVar9;
      token->currentProducer = token->desiredProducer;
      token->itemsConsumedFromCurrent = 0;
      if (lVar2 != 0 || pCVar3 != (ConcurrentQueueProducerTypelessBase *)0x0) goto LAB_00174734;
    }
    bVar6 = false;
  }
  else {
LAB_00174734:
    ppPVar12 = &token->currentProducer[-1].token;
    if (*(char *)&token->currentProducer[2].token == '\x01') {
      bVar6 = ExplicitProducer::dequeue<_zframe_t*>((ExplicitProducer *)ppPVar12,item);
    }
    else {
      bVar6 = ImplicitProducer::dequeue<_zframe_t*>((ImplicitProducer *)ppPVar12,item);
    }
    if (bVar6 == false) {
      pEVar5 = *(ExplicitProducer **)this;
      pCVar3 = token->currentProducer->next;
      this_00 = (ExplicitProducer *)&pCVar3[-1].token;
      if (pCVar3 == (ConcurrentQueueProducerTypelessBase *)0x0) {
        this_00 = pEVar5;
      }
      bVar14 = this_00 == (ExplicitProducer *)&token->currentProducer[-1].token;
      while (bVar6 = !bVar14, !bVar14) {
        if (this_00[0x48] == (ExplicitProducer)0x1) {
          bVar6 = ExplicitProducer::dequeue<_zframe_t*>(this_00,item);
        }
        else {
          bVar6 = ImplicitProducer::dequeue<_zframe_t*>((ImplicitProducer *)this_00,item);
        }
        if (bVar6 != false) {
          token->currentProducer = (ConcurrentQueueProducerTypelessBase *)(this_00 + 8);
          token->itemsConsumedFromCurrent = 1;
          return true;
        }
        pCVar3 = ((ConcurrentQueueProducerTypelessBase *)(this_00 + 8))->next;
        this_00 = (ExplicitProducer *)&pCVar3[-1].token;
        if (pCVar3 == (ConcurrentQueueProducerTypelessBase *)0x0) {
          this_00 = pEVar5;
        }
        pEVar10 = (ExplicitProducer *)&token->currentProducer[-1].token;
        if (token->currentProducer == (ConcurrentQueueProducerTypelessBase *)0x0) {
          pEVar10 = (ExplicitProducer *)0x0;
        }
        bVar14 = this_00 == pEVar10;
      }
    }
    else {
      uVar9 = token->itemsConsumedFromCurrent + 1;
      token->itemsConsumedFromCurrent = uVar9;
      bVar6 = true;
      if (uVar9 == 0x100) {
        LOCK();
        *(int *)(this + 0x260) = *(int *)(this + 0x260) + 1;
        UNLOCK();
      }
    }
  }
  return bVar6;
}

Assistant:

bool try_dequeue(consumer_token_t& token, U& item)
	{
		// The idea is roughly as follows:
		// Every 256 items from one producer, make everyone rotate (increase the global offset) -> this means the highest efficiency consumer dictates the rotation speed of everyone else, more or less
		// If you see that the global offset has changed, you must reset your consumption counter and move to your designated place
		// If there's no items where you're supposed to be, keep moving until you find a producer with some items
		// If the global offset has not changed but you've run out of items to consume, move over from your current position until you find an producer with something in it
		
		if (token.desiredProducer == nullptr || token.lastKnownGlobalOffset != globalExplicitConsumerOffset.load(std::memory_order_relaxed)) {
			if (!update_current_producer_after_rotation(token)) {
				return false;
			}
		}
		
		// If there was at least one non-empty queue but it appears empty at the time
		// we try to dequeue from it, we need to make sure every queue's been tried
		if (static_cast<ProducerBase*>(token.currentProducer)->dequeue(item)) {
			if (++token.itemsConsumedFromCurrent == EXPLICIT_CONSUMER_CONSUMPTION_QUOTA_BEFORE_ROTATE) {
				globalExplicitConsumerOffset.fetch_add(1, std::memory_order_relaxed);
			}
			return true;
		}
		
		auto tail = producerListTail.load(std::memory_order_acquire);
		auto ptr = static_cast<ProducerBase*>(token.currentProducer)->next_prod();
		if (ptr == nullptr) {
			ptr = tail;
		}
		while (ptr != static_cast<ProducerBase*>(token.currentProducer)) {
			if (ptr->dequeue(item)) {
				token.currentProducer = ptr;
				token.itemsConsumedFromCurrent = 1;
				return true;
			}
			ptr = ptr->next_prod();
			if (ptr == nullptr) {
				ptr = tail;
			}
		}
		return false;
	}